

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O2

int ReadDataMS580314BA(MS580314BA *pMS580314BA,int ind,unsigned_long *pValue)

{
  int iVar1;
  uint uVar2;
  char *__s;
  int nbReadBytes;
  uint8 writebuf [3];
  uint8 readbuf [50];
  
  nbReadBytes = 0;
  writebuf[0] = 'T';
  writebuf[1] = 0xef;
  writebuf[2] = '\x03';
  iVar1 = WriteAllRS232Port(&pMS580314BA->RS232Port,writebuf,3);
  if (iVar1 == 0) {
    mSleep(10);
    iVar1 = ReadRS232Port(&pMS580314BA->RS232Port,readbuf,0x32,&nbReadBytes);
    if (iVar1 == 0) {
      if (ind == 1) {
        uVar2 = (uint)readbuf[3] << 8 | (uint)readbuf[2] << 0x10;
        readbuf[5] = readbuf[4];
      }
      else {
        if (ind != 0) {
          return 0;
        }
        uVar2 = (uint)readbuf[4] << 8 | (uint)readbuf[3] << 0x10;
      }
      *pValue = (ulong)readbuf[5] | (ulong)uVar2;
      return 0;
    }
    __s = "Error reading data from a MS580314BA. ";
  }
  else {
    __s = "Error writing data to a MS580314BA. ";
  }
  puts(__s);
  return 1;
}

Assistant:

inline int ReadDataMS580314BA(MS580314BA* pMS580314BA, int ind, unsigned long* pValue)
{
	uint8 writebuf[3];
	uint8 readbuf[50];
	int nbReadBytes = 0;
	
	writebuf[0] = (uint8)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	writebuf[1] = (uint8)0xEF; // I2C address
	writebuf[2] = (uint8)0x03; // Number of bytes

	if (WriteAllRS232Port(&pMS580314BA->RS232Port, writebuf, 3) != EXIT_SUCCESS)
	{ 
		printf("Error writing data to a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	mSleep(10);

	if (ReadRS232Port(&pMS580314BA->RS232Port, readbuf, 50, &nbReadBytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a MS580314BA. \n");
		return EXIT_FAILURE;
	}

	//printf("%d  %d  %d  %d  %d  %d  %d  %d \n",buf[0],buf[1],buf[2],buf[3],buf[4],buf[5],buf[6],buf[7]);
	if (ind == 0) { *pValue = readbuf[3] * (unsigned long)65536 + readbuf[4] * (unsigned long)256 + readbuf[5]; }
	if (ind == 1) { *pValue = readbuf[2] * (unsigned long)65536 + readbuf[3] * (unsigned long)256 + readbuf[4]; }
	//printf(" %d  \n",ret);

	return EXIT_SUCCESS;
}